

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerLockDb(Pager *pPager,int eLock)

{
  int iVar1;
  
  iVar1 = 0;
  if (pPager->eLock == 5 || (int)(uint)pPager->eLock < eLock) {
    iVar1 = 0;
    if (pPager->noLock == '\0') {
      iVar1 = (*pPager->fd->pMethods->xLock)(pPager->fd,eLock);
    }
    if ((iVar1 == 0) && ((iVar1 = 0, eLock == 4 || (pPager->eLock != '\x05')))) {
      pPager->eLock = (u8)eLock;
    }
  }
  return iVar1;
}

Assistant:

static int pagerLockDb(Pager *pPager, int eLock){
  int rc = SQLITE_OK;

  assert( eLock==SHARED_LOCK || eLock==RESERVED_LOCK || eLock==EXCLUSIVE_LOCK );
  if( pPager->eLock<eLock || pPager->eLock==UNKNOWN_LOCK ){
    rc = pPager->noLock ? SQLITE_OK : sqlite3OsLock(pPager->fd, eLock);
    if( rc==SQLITE_OK && (pPager->eLock!=UNKNOWN_LOCK||eLock==EXCLUSIVE_LOCK) ){
      pPager->eLock = (u8)eLock;
      IOTRACE(("LOCK %p %d\n", pPager, eLock))
    }
  }
  return rc;
}